

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utext.cpp
# Opt level: O0

UChar32 utext_previous32_63(UText *ut)

{
  UBool UVar1;
  UChar32 supplementary;
  UChar32 lead;
  UChar32 c;
  UText *ut_local;
  
  if ((ut->chunkOffset < 1) &&
     (UVar1 = (*ut->pFuncs->access)(ut,ut->chunkNativeStart,'\0'), UVar1 == '\0')) {
    ut_local._4_4_ = 0xffffffff;
  }
  else {
    ut->chunkOffset = ut->chunkOffset + -1;
    ut_local._4_4_ = (uint)(ushort)ut->chunkContents[ut->chunkOffset];
    if (((ut_local._4_4_ & 0xfffffc00) == 0xdc00) &&
       (((0 < ut->chunkOffset ||
         (UVar1 = (*ut->pFuncs->access)(ut,ut->chunkNativeStart,'\0'), UVar1 != '\0')) &&
        (((ushort)ut->chunkContents[ut->chunkOffset + -1] & 0xfffffc00) == 0xd800)))) {
      ut_local._4_4_ =
           (uint)(ushort)ut->chunkContents[ut->chunkOffset + -1] * 0x400 + ut_local._4_4_ +
           0xfca02400;
      ut->chunkOffset = ut->chunkOffset + -1;
    }
  }
  return ut_local._4_4_;
}

Assistant:

U_CAPI UChar32 U_EXPORT2
utext_previous32(UText *ut) {
    UChar32       c;

    if (ut->chunkOffset <= 0) {
        if (ut->pFuncs->access(ut, ut->chunkNativeStart, FALSE) == FALSE) {
            return U_SENTINEL;
        }
    }
    ut->chunkOffset--;
    c = ut->chunkContents[ut->chunkOffset];
    if (U16_IS_TRAIL(c) == FALSE) {
        // Normal case, not supplementary.
        //   (A lead surrogate seen here is just returned as is, as a surrogate value.
        //    It cannot be part of a pair.)
        return c;
    }

    if (ut->chunkOffset <= 0) {
        if (ut->pFuncs->access(ut, ut->chunkNativeStart, FALSE) == FALSE) {
            // c is an unpaired trail surrogate at the start of the text.
            // return it as it is.
            return c;
        }
    }

    UChar32 lead = ut->chunkContents[ut->chunkOffset-1];
    if (U16_IS_LEAD(lead) == FALSE) {
        // c was an unpaired trail surrogate, not at the end of the text.
        // return it as it is (unpaired).  Iteration position is at c
        return c;
    }

    UChar32 supplementary = U16_GET_SUPPLEMENTARY(lead, c);
    ut->chunkOffset--;   // move iteration position over the lead surrogate.
    return supplementary;
}